

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_State_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Minefield_State_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Minefield_State_PDU *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer pPVar3;
  pointer pEVar4;
  KINT32 Value;
  KINT32 Value_00;
  KString local_350;
  KString local_330;
  __normal_iterator<const_KDIS::DATA_TYPE::EntityType_*,_std::vector<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>_>
  local_310;
  const_iterator citrEndTyp;
  const_iterator citrTyp;
  KString local_2e0;
  __normal_iterator<const_KDIS::DATA_TYPE::PerimeterPointCoordinate_*,_std::vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>_>
  local_2c0;
  const_iterator citrEndPnt;
  const_iterator citrPnt;
  KString local_290;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Minefield_State_PDU *local_18;
  Minefield_State_PDU *this_local;
  
  local_18 = this;
  this_local = (Minefield_State_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar2 = std::operator<<(local_190,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"-Minefield State PDU-\n");
  Minefield_Header::GetAsString_abi_cxx11_(&local_1f0,&this->super_Minefield_Header);
  poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
  poVar2 = std::operator<<(poVar2,"Sequence Number:     ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->m_SeqNumUnion).m_ui16SeqNum >> 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Force ID:            ");
  DATA_TYPE::ENUMS::GetEnumAsStringForceID_abi_cxx11_
            (&local_210,(ENUMS *)(ulong)this->m_ui8ForceID,Value);
  poVar2 = std::operator<<(poVar2,(string *)&local_210);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Number Perim Points: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8NumPerimPoints);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Minefield Type:      ");
  DATA_TYPE::EntityType::GetAsString_abi_cxx11_(&local_230,&this->m_MinefieldType);
  poVar2 = std::operator<<(poVar2,(string *)&local_230);
  poVar2 = std::operator<<(poVar2,"Number Mine Types:   ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16NumMineTypes);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Minefield Location:  ");
  DATA_TYPE::WorldCoordinates::GetAsString_abi_cxx11_(&local_250,&this->m_Loc);
  poVar2 = std::operator<<(poVar2,(string *)&local_250);
  poVar2 = std::operator<<(poVar2,"Orientation:         ");
  DATA_TYPE::EulerAngles::GetAsString_abi_cxx11_(&local_270,&this->m_Ori);
  poVar2 = std::operator<<(poVar2,(string *)&local_270);
  DATA_TYPE::MinefieldAppearance::GetAsString_abi_cxx11_(&local_290,&this->m_App);
  poVar2 = std::operator<<(poVar2,(string *)&local_290);
  poVar2 = std::operator<<(poVar2,"Protocol Mode:       ");
  DATA_TYPE::ENUMS::GetEnumAsStringMinefieldProtocolMode_abi_cxx11_
            ((KString *)&citrPnt,
             (ENUMS *)(ulong)((this->m_ui16ProtocolModeUnion).m_ui16ProtocolMode16 & 3),Value_00);
  poVar2 = std::operator<<(poVar2,(string *)&citrPnt);
  poVar2 = std::operator<<(poVar2,"\n");
  std::operator<<(poVar2,"Perimeter Points:\n");
  std::__cxx11::string::~string((string *)&citrPnt);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  citrEndPnt = std::
               vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
               ::begin(&this->m_vPoints);
  local_2c0._M_current =
       (PerimeterPointCoordinate *)
       std::
       vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
       ::end(&this->m_vPoints);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEndPnt,&local_2c0);
    if (!bVar1) break;
    pPVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::PerimeterPointCoordinate_*,_std::vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>_>
             ::operator->(&citrEndPnt);
    (*(pPVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(&citrTyp);
    UTILS::IndentString(&local_2e0,(KString *)&citrTyp,1,'\t');
    std::operator<<(local_190,(string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&citrTyp);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::PerimeterPointCoordinate_*,_std::vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>_>
    ::operator++(&citrEndPnt);
  }
  std::operator<<(local_190,"Mine Types:\n");
  citrEndTyp = std::
               vector<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>::
               begin(&this->m_vMineTypes);
  local_310._M_current =
       (EntityType *)
       std::vector<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>::end
                 (&this->m_vMineTypes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEndTyp,&local_310);
    if (!bVar1) break;
    pEVar4 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::EntityType_*,_std::vector<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>_>
             ::operator->(&citrEndTyp);
    (*(pEVar4->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_350);
    UTILS::IndentString(&local_330,&local_350,1,'\t');
    std::operator<<(local_190,(string *)&local_330);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_350);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::EntityType_*,_std::vector<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>_>
    ::operator++(&citrEndTyp);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Minefield_State_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Minefield State PDU-\n"
       << Minefield_Header::GetAsString()
       << "Sequence Number:     " << m_SeqNumUnion.m_ui16SeqNum15           << "\n"
       << "Force ID:            " << GetEnumAsStringForceID( m_ui8ForceID ) << "\n"
       << "Number Perim Points: " << ( KUINT16 )m_ui8NumPerimPoints         << "\n"
       << "Minefield Type:      " << m_MinefieldType.GetAsString()
       << "Number Mine Types:   " << m_ui16NumMineTypes                     << "\n"
       << "Minefield Location:  " << m_Loc.GetAsString()
       << "Orientation:         " << m_Ori.GetAsString()
       << m_App.GetAsString()
       << "Protocol Mode:       " << GetEnumAsStringMinefieldProtocolMode( m_ui16ProtocolModeUnion.m_ui16ProtocolMode2 ) << "\n"
       << "Perimeter Points:\n";

    std::vector<PerimeterPointCoordinate>::const_iterator citrPnt = m_vPoints.begin();
    std::vector<PerimeterPointCoordinate>::const_iterator citrEndPnt = m_vPoints.end();
    for( ; citrPnt != citrEndPnt; ++citrPnt )
    {
        ss << IndentString( citrPnt->GetAsString(), 1 );
    }

    ss << "Mine Types:\n";

    std::vector<EntityType>::const_iterator citrTyp = m_vMineTypes.begin();
    std::vector<EntityType>::const_iterator citrEndTyp = m_vMineTypes.end();
    for( ; citrTyp != citrEndTyp; ++citrTyp )
    {
        ss << IndentString( citrTyp->GetAsString(), 1 );
    }

    return ss.str();
}